

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O2

void __thiscall MD5::print(MD5 *this)

{
  long lVar1;
  Digest digest_val;
  
  digest(this,digest_val);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    printf("%02x",(ulong)digest_val[lVar1]);
  }
  putchar(10);
  return;
}

Assistant:

void
MD5::print()
{
    Digest digest_val;
    digest(digest_val);

    unsigned int i;
    for (i = 0; i < 16; ++i) {
        printf("%02x", digest_val[i]);
    }
    printf("\n");
}